

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_exception.c
# Opt level: O0

exception exception_create_const(char *message,char *label,int64_t code,char *stacktrace)

{
  exception __ptr;
  size_t sVar1;
  char *pcVar2;
  uint64_t uVar3;
  char *in_RCX;
  int64_t in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t stacktrace_size;
  size_t label_size;
  size_t message_size;
  exception ex;
  
  __ptr = (exception)malloc(0x30);
  if (__ptr == (exception)0x0) {
    return (exception)0x0;
  }
  if (in_RDI == (char *)0x0) {
    __ptr->message = (char *)0x0;
  }
  else {
    sVar1 = strlen(in_RDI);
    pcVar2 = (char *)malloc(sVar1 + 1);
    __ptr->message = pcVar2;
    if (__ptr->message == (char *)0x0) goto LAB_0010c4c3;
    memcpy(__ptr->message,in_RDI,sVar1 + 1);
  }
  if (in_RSI == (char *)0x0) {
    __ptr->label = (char *)0x0;
LAB_0010c3ea:
    if (in_RCX == (char *)0x0) {
      __ptr->stacktrace = (char *)0x0;
LAB_0010c454:
      __ptr->code = in_RDX;
      uVar3 = thread_id_get_current();
      __ptr->id = uVar3;
      threading_atomic_ref_count_initialize((threading_atomic_ref_count)0x10c481);
      LOCK();
      UNLOCK();
      exception_stats.allocations = exception_stats.allocations + 1;
      return __ptr;
    }
    sVar1 = strlen(in_RCX);
    pcVar2 = (char *)malloc(sVar1 + 1);
    __ptr->stacktrace = pcVar2;
    if (__ptr->stacktrace != (char *)0x0) {
      memcpy(__ptr->stacktrace,in_RCX,sVar1 + 1);
      goto LAB_0010c454;
    }
    free(__ptr->label);
  }
  else {
    sVar1 = strlen(in_RSI);
    pcVar2 = (char *)malloc(sVar1 + 1);
    __ptr->label = pcVar2;
    if (__ptr->label != (char *)0x0) {
      memcpy(__ptr->label,in_RSI,sVar1 + 1);
      goto LAB_0010c3ea;
    }
  }
  free(__ptr->message);
LAB_0010c4c3:
  free(__ptr);
  return (exception)0x0;
}

Assistant:

exception exception_create_const(const char *message, const char *label, int64_t code, const char *stacktrace)
{
	exception ex = malloc(sizeof(struct exception_type));

	if (ex == NULL)
	{
		goto exception_bad_alloc;
	}

	if (message != NULL)
	{
		size_t message_size = strlen(message) + 1;

		ex->message = malloc(sizeof(char) * message_size);

		if (ex->message == NULL)
		{
			goto message_bad_alloc;
		}

		memcpy(ex->message, message, message_size);
	}
	else
	{
		ex->message = NULL;
	}

	if (label != NULL)
	{
		size_t label_size = strlen(label) + 1;

		ex->label = malloc(sizeof(char) * label_size);

		if (ex->label == NULL)
		{
			goto label_bad_alloc;
		}

		memcpy(ex->label, label, label_size);
	}
	else
	{
		ex->label = NULL;
	}

	if (stacktrace != NULL)
	{
		size_t stacktrace_size = strlen(stacktrace) + 1;

		ex->stacktrace = malloc(sizeof(char) * stacktrace_size);

		if (ex->stacktrace == NULL)
		{
			goto stacktrace_bad_alloc;
		}

		memcpy(ex->stacktrace, stacktrace, stacktrace_size);
	}
	else
	{
		ex->stacktrace = NULL;
	}

	ex->code = code;
	ex->id = thread_id_get_current();

	threading_atomic_ref_count_initialize(&ex->ref);

	reflect_memory_tracker_allocation(exception_stats);

	return ex;

stacktrace_bad_alloc:
	free(ex->label);
label_bad_alloc:
	free(ex->message);
message_bad_alloc:
	free(ex);
exception_bad_alloc:
	return NULL;
}